

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolj.c
# Opt level: O0

int ffi4fstr(long *input,long ntodo,double scale,double zero,char *cform,long twidth,char *output,
            int *status)

{
  char *local_60;
  char *cptr;
  double dvalue;
  long ii;
  int *status_local;
  char *output_local;
  long twidth_local;
  char *cform_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  long *input_local;
  
  local_60 = output;
  status_local = (int *)output;
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      snprintf((char *)status_local,0x7080,cform,((double)input[(long)dvalue] - zero) / scale);
      status_local = (int *)(twidth + (long)status_local);
      if ((char)*status_local != '\0') {
        *status = -0xb;
      }
    }
  }
  else {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      snprintf((char *)status_local,0x7080,cform,(double)input[(long)dvalue]);
      status_local = (int *)(twidth + (long)status_local);
      if ((char)*status_local != '\0') {
        *status = -0xb;
      }
    }
  }
  while (local_60 = strchr(local_60,0x2c), local_60 != (char *)0x0) {
    *local_60 = '.';
  }
  return *status;
}

Assistant:

int ffi4fstr(long *input,      /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            char *cform,       /* I - format for output string values  */
            long twidth,       /* I - width of each field, in chars    */
            char *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do scaling if required.
*/
{
    long ii;
    double dvalue;
    char *cptr;

    cptr = output;
    
    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
           snprintf(output, DBUFFSIZE, cform, (double) input[ii]);
           output += twidth;

           if (*output)  /* if this char != \0, then overflow occurred */
              *status = OVERFLOW_ERR;
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
          dvalue = (input[ii] - zero) / scale;
          snprintf(output, DBUFFSIZE, cform, dvalue);
          output += twidth;

          if (*output)  /* if this char != \0, then overflow occurred */
            *status = OVERFLOW_ERR;
        }
    }

    /* replace any commas with periods (e.g., in French locale) */
    while ((cptr = strchr(cptr, ','))) *cptr = '.';

    return(*status);
}